

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestAddBignum(void)

{
  Bignum other;
  Bignum bignum;
  char buffer [1024];
  undefined4 in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7ec;
  Bignum *in_stack_fffffffffffff7f0;
  Chunk in_stack_fffffffffffff7f8;
  undefined2 in_stack_fffffffffffff7fc;
  uint16_t in_stack_fffffffffffff7fe;
  Bignum *in_stack_fffffffffffff800;
  Chunk in_stack_fffffffffffff808;
  Chunk in_stack_fffffffffffff80c;
  Bignum *in_stack_fffffffffffff810;
  Chunk in_stack_fffffffffffff81c;
  char *in_stack_fffffffffffff820;
  Bignum *in_stack_fffffffffffff828;
  Bignum *in_stack_fffffffffffff838;
  Bignum *in_stack_fffffffffffff840;
  Bignum local_60c [3];
  
  double_conversion::Bignum::Bignum(local_60c);
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff7f0);
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec);
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  AssignHexString(in_stack_fffffffffffff810,
                  (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffff800,in_stack_fffffffffffff7fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec);
  double_conversion::Bignum::AddBignum(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff81c);
  CheckHelper((char *)in_stack_fffffffffffff800,
              CONCAT22(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7fc),
              (char *)in_stack_fffffffffffff7f0,SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                    (char *)in_stack_fffffffffffff800,
                    (char *)CONCAT26(in_stack_fffffffffffff7fe,
                                     CONCAT24(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)),
                    (char *)in_stack_fffffffffffff7f0,
                    (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  return;
}

Assistant:

TEST(AddBignum) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum other;

  AssignHexString(&other, "1");
  AssignHexString(&bignum, "0");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000000000000000001", buffer);

  AssignHexString(&other, "1000000000000");

  AssignHexString(&bignum, "1");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000001000000000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000FFFFFFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000001000000000000", buffer);

  other.ShiftLeft(64);
  CHECK(other.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000010000000000000000000000000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000FFFFFFFFFFFFFFFFFFFFFFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10010000000000000000000000000", buffer);
}